

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

void __thiscall
ws::Record::add_helper<std::__cxx11::string&,char_const(&)[9],int&>
          (Record *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f,
          char (*args) [9],int *args_1)

{
  int *args_local_1;
  char (*args_local) [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f_local;
  Record *this_local;
  
  add<std::__cxx11::string&>(this,f);
  add_helper<char_const(&)[9],int&>(this,args,args_1);
  return;
}

Assistant:

void add_helper(T &&f, Args &&...args)
    {
      add(std::forward<T>(f));
      add_helper(std::forward<Args>(args)...);
    }